

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v1.cpp
# Opt level: O2

void __thiscall
LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1
          (LASwriteItemCompressed_POINT10_v1 *this)

{
  IntegerCompressor *pIVar1;
  ArithmeticModel *pAVar2;
  long lVar3;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_00160020;
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_scan_angle_rank;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  ArithmeticEncoder::destroySymbolModel(this->enc,this->m_changed_values);
  for (lVar3 = -0x800; lVar3 != 0; lVar3 = lVar3 + 8) {
    pAVar2 = *(ArithmeticModel **)((long)this->m_classification + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,pAVar2);
    }
    pAVar2 = *(ArithmeticModel **)((long)this->m_user_data + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,pAVar2);
    }
    if (*(ArithmeticModel **)(this[1].last_item + lVar3 + -0x10) != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel
                (this->enc,*(ArithmeticModel **)(this[1].last_item + lVar3 + -0x10));
    }
  }
  return;
}

Assistant:

LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1()
{
  U32 i;
  delete ic_dx;
  delete ic_dy;
  delete ic_z;
  delete ic_intensity;
  delete ic_scan_angle_rank;
  delete ic_point_source_ID;
  enc->destroySymbolModel(m_changed_values);
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) enc->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) enc->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) enc->destroySymbolModel(m_user_data[i]);
  }
}